

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O2

void bench_keygen_run(void *arg,int iters)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  size_t len;
  uchar pub33 [33];
  secp256k1_pubkey pubkey;
  undefined8 local_a0;
  undefined1 local_98;
  undefined8 local_97;
  undefined8 uStack_8f;
  undefined8 local_87;
  undefined8 uStack_7f;
  undefined1 local_70 [64];
  
  iVar3 = 0;
  if (0 < iters) {
    iVar3 = iters;
  }
  while( true ) {
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) {
      return;
    }
    local_a0 = 0x21;
    iVar1 = secp256k1_ec_pubkey_create(*arg,local_70,(undefined8 *)((long)arg + 0x28));
    if (iVar1 == 0) break;
    iVar1 = secp256k1_ec_pubkey_serialize(*arg,&local_98,&local_a0,local_70,0x102);
    if (iVar1 == 0) {
      pcVar4 = 
      "test condition failed: secp256k1_ec_pubkey_serialize(data->ctx, pub33, &len, &pubkey, SECP256K1_EC_COMPRESSED)"
      ;
      uVar2 = 0x92;
      goto LAB_00103823;
    }
    *(undefined8 *)((long)arg + 0x38) = local_87;
    *(undefined8 *)((long)arg + 0x40) = uStack_7f;
    *(undefined8 *)((long)arg + 0x28) = local_97;
    *(undefined8 *)((long)arg + 0x30) = uStack_8f;
  }
  pcVar4 = "test condition failed: secp256k1_ec_pubkey_create(data->ctx, &pubkey, data->key)";
  uVar2 = 0x91;
LAB_00103823:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/bench.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

static void bench_keygen_run(void *arg, int iters) {
    int i;
    bench_data *data = (bench_data*)arg;

    for (i = 0; i < iters; i++) {
        unsigned char pub33[33];
        size_t len = 33;
        secp256k1_pubkey pubkey;
        CHECK(secp256k1_ec_pubkey_create(data->ctx, &pubkey, data->key));
        CHECK(secp256k1_ec_pubkey_serialize(data->ctx, pub33, &len, &pubkey, SECP256K1_EC_COMPRESSED));
        memcpy(data->key, pub33 + 1, 32);
    }
}